

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_func_sig_return_test.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  int iVar2;
  __pid_t _Var3;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  int local_18;
  pid_t tmp_pid;
  int wait_ret;
  int i;
  int tmp_err;
  
  i = 0;
  wait_ret = 0;
  main_pid = getpid();
  log_formatted("Parent pid is %d",(ulong)(uint)main_pid);
  sigemptyset((sigset_t *)&action.sa_mask);
  action.sa_flags = 0;
  action.__sigaction_handler.sa_handler = catch_async_return;
  iVar2 = __libc_current_sigrtmin();
  wait_ret = sigaction(iVar2 + 1,(sigaction *)&action,(sigaction *)0x0);
  if (wait_ret == -1) {
    log_formatted("Error in setup");
    exit(1);
  }
  for (tmp_pid = 0; tmp_pid < 1000; tmp_pid = tmp_pid + 1) {
    long_async_func(tmp_pid % 2);
  }
  while( true ) {
    if (await_forks == 0) {
      log_formatted("Parent received # of returned values: %d\n",comm_sumary.acc);
      return 0;
    }
    local_18 = 0;
    _Var3 = wait(&local_18);
    if ((_Var3 == -1) || (local_18 != 0)) break;
    await_forks = await_forks - 1;
  }
  puVar4 = (uint *)__errno_location();
  uVar1 = *puVar4;
  piVar5 = __errno_location();
  pcVar6 = strerror(*piVar5);
  log_formatted("Parent received failure: %d, %s",(ulong)uVar1,pcVar6);
  exit(1);
}

Assistant:

int main() {
    int tmp_err = 0;
    main_pid = getpid();
    log_formatted("Parent pid is %d", main_pid);

    // setup signal handlers
    sigemptyset(&action.sa_mask);
    action.sa_flags = 0;
    action.sa_handler = catch_async_return;

    tmp_err = sigaction(NOTIFY_SIG, &action, NULL);
    if(tmp_err == -1) {
        log_formatted("Error in setup");
        exit(EXIT_FAILURE);
    }

    // create workers
    for(int i=0; i<N_FORKS; i++) {
        long_async_func(i%2);
    }

    // wait for workers to finish
    while (await_forks) {
        int wait_ret = EXIT_SUCCESS;
        pid_t tmp_pid = wait(&wait_ret);
        if(tmp_pid == -1 || wait_ret != EXIT_SUCCESS) {
            log_formatted("Parent received failure: %d, %s", errno, strerror(errno));
            exit(EXIT_FAILURE);
        }
        await_forks--;
    }
    log_formatted("Parent received # of returned values: %d\n", comm_sumary.acc);
    assert(comm_sumary.acc == N_FORKS/2);
    return 0;
}